

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# filtration_algorithms.h
# Opt level: O1

filtration_algorithm_t * get_filtration_computer(string *algorithm)

{
  size_type sVar1;
  pointer pcVar2;
  int iVar3;
  filtration_algorithm_t *pfVar4;
  long *plVar5;
  invalid_argument *this;
  long *plVar6;
  size_type sVar7;
  string err_msg;
  long *local_80;
  long local_78;
  long local_70;
  long lStack_68;
  string local_60;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> local_40;
  
  sVar1 = algorithm->_M_string_length;
  if (sVar1 != 0) {
    pcVar2 = (algorithm->_M_dataplus)._M_p;
    sVar7 = 0;
    do {
      iVar3 = tolower((int)pcVar2[sVar7]);
      pcVar2[sVar7] = (char)iVar3;
      sVar7 = sVar7 + 1;
    } while (sVar1 != sVar7);
  }
  iVar3 = std::__cxx11::string::compare((char *)algorithm);
  if ((iVar3 == 0) || (iVar3 = std::__cxx11::string::compare((char *)algorithm), iVar3 == 0)) {
    return (filtration_algorithm_t *)0x0;
  }
  pcVar2 = (algorithm->_M_dataplus)._M_p;
  local_60._M_dataplus._M_p = (pointer)&local_60.field_2;
  std::__cxx11::string::_M_construct<char*>
            ((string *)&local_60,pcVar2,pcVar2 + algorithm->_M_string_length);
  pfVar4 = get_custom_filtration_computer(&local_60);
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_60._M_dataplus._M_p != &local_60.field_2) {
    operator_delete(local_60._M_dataplus._M_p,local_60.field_2._M_allocated_capacity + 1);
  }
  if (pfVar4 != (filtration_algorithm_t *)0x0) {
    return pfVar4;
  }
  std::operator+(&local_40,"The filtration algorithm \"",algorithm);
  plVar5 = (long *)std::__cxx11::string::append((char *)&local_40);
  local_80 = (long *)*plVar5;
  plVar6 = plVar5 + 2;
  if (local_80 == plVar6) {
    local_70 = *plVar6;
    lStack_68 = plVar5[3];
    local_80 = &local_70;
  }
  else {
    local_70 = *plVar6;
  }
  local_78 = plVar5[1];
  *plVar5 = (long)plVar6;
  plVar5[1] = 0;
  *(undefined1 *)(plVar5 + 2) = 0;
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)local_40._M_dataplus._M_p != &local_40.field_2) {
    operator_delete(local_40._M_dataplus._M_p,local_40.field_2._M_allocated_capacity + 1);
  }
  this = (invalid_argument *)__cxa_allocate_exception(0x10);
  std::invalid_argument::invalid_argument(this,(string *)&local_80);
  __cxa_throw(this,&std::invalid_argument::typeinfo,std::invalid_argument::~invalid_argument);
}

Assistant:

filtration_algorithm_t* get_filtration_computer(std::string algorithm) {
	std::transform(algorithm.begin(), algorithm.end(), algorithm.begin(), ::tolower);

	// For the trivial filtration, skip the computation of filtration values altogether
	if (algorithm == "zero" || algorithm == "") return nullptr;

	filtration_algorithm_t* custom = get_custom_filtration_computer(algorithm);

	if (custom != nullptr) return custom;

	std::string err_msg = "The filtration algorithm \"" + algorithm + "\" could not be found.";
	throw std::invalid_argument(err_msg);
}